

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O3

Error * ot::commissioner::WriteFile(Error *__return_storage_ptr__,string *aData,string *aFilename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  FILE *__stream;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string local_b8;
  ErrorCode local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  local_68;
  
  __return_storage_ptr__->mCode = kNone;
  paVar1 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  __stream = fopen((aFilename->_M_dataplus)._M_p,"w");
  if (__stream == (FILE *)0x0) {
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    local_70 = paVar1;
    if (iVar2 == 0xd) {
      local_68.types_[0] = string_type;
      local_68.types_[1] = cstring_type;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "access denied on path \'{}\', {}";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
      local_68.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      local_68.parse_funcs_[1] =
           ::fmt::v10::detail::
           parse_format_specs<char*,fmt::v10::detail::compile_parse_context<char>>;
      pcVar5 = "access denied on path \'{}\', {}";
      local_68.context_.types_ = local_68.types_;
      do {
        pcVar4 = pcVar5 + 1;
        if (*pcVar5 == '}') {
          if ((pcVar4 == "") || (*pcVar4 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar4 = pcVar5 + 2;
        }
        else if (*pcVar5 == '{') {
          pcVar4 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,char*>&>
                             (pcVar5,"",&local_68);
        }
        pcVar5 = pcVar4;
      } while (pcVar4 != "");
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ =
           (size_t)strerror(*piVar3);
      local_68.types_ = (type  [2])(aFilename->_M_dataplus)._M_p;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           (char *)aFilename->_M_string_length;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_68;
      fmt_00.size_ = 0xcd;
      fmt_00.data_ = (char *)0x1e;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_b8,(v10 *)"access denied on path \'{}\', {}",fmt_00,args_00);
      local_98 = kIOBusy;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,local_b8._M_dataplus._M_p,
                 local_b8._M_dataplus._M_p + local_b8._M_string_length);
    }
    else if ((iVar2 == 0x15) || (iVar2 == 0x11)) {
      local_68.types_[0] = string_type;
      local_68.types_[1] = cstring_type;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "path already exists \'{}\', {}";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1c;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
      local_68.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      local_68.parse_funcs_[1] =
           ::fmt::v10::detail::
           parse_format_specs<char*,fmt::v10::detail::compile_parse_context<char>>;
      pcVar5 = "path already exists \'{}\', {}";
      local_68.context_.types_ = local_68.types_;
      do {
        pcVar4 = pcVar5 + 1;
        if (*pcVar5 == '}') {
          if ((pcVar4 == "") || (*pcVar4 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar4 = pcVar5 + 2;
        }
        else if (*pcVar5 == '{') {
          pcVar4 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,char*>&>
                             (pcVar5,"",&local_68);
        }
        pcVar5 = pcVar4;
      } while (pcVar4 != "");
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ =
           (size_t)strerror(*piVar3);
      local_68.types_ = (type  [2])(aFilename->_M_dataplus)._M_p;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           (char *)aFilename->_M_string_length;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_68;
      fmt.size_ = 0xcd;
      fmt.data_ = (char *)0x1c;
      ::fmt::v10::vformat_abi_cxx11_(&local_b8,(v10 *)"path already exists \'{}\', {}",fmt,args);
      local_98 = kAlreadyExists;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,local_b8._M_dataplus._M_p,
                 local_b8._M_dataplus._M_p + local_b8._M_string_length);
    }
    else {
      local_68.types_[0] = string_type;
      local_68.types_[1] = cstring_type;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "error on opening file \'{}\', {}";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
      local_68.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      local_68.parse_funcs_[1] =
           ::fmt::v10::detail::
           parse_format_specs<char*,fmt::v10::detail::compile_parse_context<char>>;
      pcVar5 = "error on opening file \'{}\', {}";
      local_68.context_.types_ = local_68.types_;
      do {
        pcVar4 = pcVar5 + 1;
        if (*pcVar5 == '}') {
          if ((pcVar4 == "") || (*pcVar4 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar4 = pcVar5 + 2;
        }
        else if (*pcVar5 == '{') {
          pcVar4 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,char*>&>
                             (pcVar5,"",&local_68);
        }
        pcVar5 = pcVar4;
      } while (pcVar4 != "");
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ =
           (size_t)strerror(*piVar3);
      local_68.types_ = (type  [2])(aFilename->_M_dataplus)._M_p;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           (char *)aFilename->_M_string_length;
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)&local_68;
      fmt_01.size_ = 0xcd;
      fmt_01.data_ = (char *)0x1e;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_b8,(v10 *)"error on opening file \'{}\', {}",fmt_01,args_01);
      local_98 = kIOError;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,local_b8._M_dataplus._M_p,
                 local_b8._M_dataplus._M_p + local_b8._M_string_length);
    }
    __return_storage_ptr__->mCode = local_98;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_90);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  else {
    fputs((aData->_M_dataplus)._M_p,__stream);
    fclose(__stream);
  }
  return __return_storage_ptr__;
}

Assistant:

Error WriteFile(const std::string &aData, const std::string &aFilename)
{
    Error error;
    FILE *f = fopen(aFilename.c_str(), "w");

    if (f == nullptr)
    {
        switch (errno)
        {
        case EEXIST:
        case EISDIR:
            ExitNow(error = ERROR_ALREADY_EXISTS("path already exists '{}', {}", aFilename, strerror(errno)));
            break;

        case EACCES:
            ExitNow(error = ERROR_IO_BUSY("access denied on path '{}', {}", aFilename, strerror(errno)));
            break;

        default:
            ExitNow(error = ERROR_IO_ERROR("error on opening file '{}', {}", aFilename, strerror(errno)));
        }
    }

    fputs(aData.c_str(), f);

exit:
    if (f != nullptr)
    {
        fclose(f);
    }

    return error;
}